

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicHandleInfo.hpp
# Opt level: O0

void __thiscall
helics::BasicHandleInfo::BasicHandleInfo(BasicHandleInfo *this,BasicHandleInfo *param_2)

{
  size_type sVar1;
  undefined8 uVar2;
  undefined8 *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000008;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  sVar1 = in_RSI[1];
  (in_RDI->_M_dataplus)._M_p = (pointer)*in_RSI;
  in_RDI->_M_string_length = sVar1;
  __str = in_RDI;
  std::__cxx11::string::string(unaff_retaddr,in_RDI);
  std::__cxx11::string::string(unaff_retaddr,__str);
  std::__cxx11::string::string(unaff_retaddr,__str);
  uVar2 = in_RSI[0xf];
  in_RDI[3].field_2._M_allocated_capacity = in_RSI[0xe];
  *(undefined8 *)((long)&in_RDI[3].field_2 + 8) = uVar2;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

BasicHandleInfo() noexcept: type_in(type), type_out(units) {}